

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

void __thiscall
jessilib::impl_join::
join_mb_append<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::basic_string_view<char16_t,std::char_traits<char16_t>>&>
          (impl_join *this,string *out_string,
          basic_string_view<char8_t,_std::char_traits<char8_t>_> *in_string,
          basic_string_view<char16_t,_std::char_traits<char16_t>_> *in_args)

{
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *local_20;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *in_args_local;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *in_string_local;
  string *out_string_local;
  
  in_string_00._M_str = (char8_t *)in_args;
  in_string_00._M_len = out_string->_M_string_length;
  local_20 = (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)in_string;
  in_args_local = (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)out_string;
  in_string_local = (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)this;
  ustring_to_mbstring<char8_t>(&local_48,(jessilib *)(out_string->_M_dataplus)._M_p,in_string_00);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_string_local,
             &local_48.second);
  std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_48);
  join_mb_append<std::basic_string_view<char16_t,std::char_traits<char16_t>>&>
            ((string *)in_string_local,local_20);
  return;
}

Assistant:

void join_mb_append(std::string& out_string, InT&& in_string, ArgsT&&... in_args) {
	// TODO: is this a valid approach? is mbstate fine it discard between appends?
	if constexpr (std::is_same_v<char32_t, InT>) {
		out_string += ustring_to_mbstring(std::u32string_view{ &in_string, 1 }).second;
	}
	else {
		out_string += ustring_to_mbstring(in_string).second;
	}

	join_mb_append(out_string, std::forward<ArgsT>(in_args)...);
}